

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

string_base<allocator_default<char>_> * __thiscall
string_base<allocator_default<char>_>::operator=
          (string_base<allocator_default<char>_> *this,char *other)

{
  int iVar1;
  char *dest;
  
  if (this->str != (char *)0x0) {
    operator_delete__(this->str);
  }
  this->str = (char *)0x0;
  this->length = 0;
  if (other != (char *)0x0) {
    iVar1 = str_length(other);
    this->length = iVar1;
    dest = (char *)operator_new__((long)(int)(iVar1 + 1U));
    this->str = dest;
    mem_copy(dest,other,iVar1 + 1U);
  }
  return this;
}

Assistant:

string_base &operator = (const char *other)
	{
		free();
		if(other)
			copy(other, str_length(other));
		return *this;
	}